

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

size_t pbrt::GetCurrentRSS(void)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long rss;
  FILE *fp;
  char *in_stack_00000068;
  int in_stack_00000074;
  char *in_stack_00000078;
  LogLevel in_stack_00000084;
  long local_18;
  FILE *local_10;
  size_t local_8;
  
  local_10 = fopen("/proc/self/statm","r");
  if (local_10 == (FILE *)0x0) {
    if (LOGGING_LogLevel < 2) {
      Log(in_stack_00000084,in_stack_00000078,in_stack_00000074,in_stack_00000068);
    }
    local_8 = 0;
  }
  else {
    local_18 = 0;
    iVar2 = __isoc99_fscanf(local_10,"%*s%ld",&local_18);
    if (iVar2 == 1) {
      fclose(local_10);
      lVar1 = local_18;
      lVar3 = sysconf(0x1e);
      local_8 = lVar1 * lVar3;
    }
    else {
      if (LOGGING_LogLevel < 2) {
        Log(in_stack_00000084,in_stack_00000078,in_stack_00000074,in_stack_00000068);
      }
      fclose(local_10);
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t GetCurrentRSS() {
#ifdef PBRT_IS_WINDOWS
    PROCESS_MEMORY_COUNTERS info;
    GetProcessMemoryInfo(GetCurrentProcess(), &info, sizeof(info));
    return (size_t)info.WorkingSetSize;
#elif defined(PBRT_IS_OSX)
    struct mach_task_basic_info info;
    mach_msg_type_number_t infoCount = MACH_TASK_BASIC_INFO_COUNT;
    if (task_info(mach_task_self(), MACH_TASK_BASIC_INFO, (task_info_t)&info,
                  &infoCount) != KERN_SUCCESS)
        return (size_t)0L; /* Can't access? */
    return (size_t)info.resident_size;

#elif defined(PBRT_IS_LINUX)
    FILE *fp;
    if ((fp = fopen("/proc/self/statm", "r")) == nullptr) {
        LOG_ERROR("Unable to open /proc/self/statm");
        return 0;
    }

    long rss = 0L;
    if (fscanf(fp, "%*s%ld", &rss) != 1) {
        LOG_ERROR("Unable to read /proc/self/statm");
        fclose(fp);
        return 0;
    }
    fclose(fp);
    return (size_t)rss * (size_t)sysconf(_SC_PAGESIZE);
#elif defined(PBRT_IS_GPU_CODE)
    return 0;
#else
#error "TODO: implement GetCurrentRSS() for this target"
    return 0;
    /*    struct rusage rusage;
    CHECK(getrusage(RUSAGE_SELF, &rusage) == 0);
    return rusage.ru_idrss;
    */
#endif
}